

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolve.cpp
# Opt level: O2

HighsStatus
solveUnconstrainedLp
          (HighsOptions *options,HighsLp *lp,HighsModelStatus *model_status,HighsInfo *highs_info,
          HighsSolution *solution,HighsBasis *basis)

{
  HighsInt *pHVar1;
  pointer pdVar2;
  pointer pHVar3;
  HighsModelStatus HVar4;
  HighsSolution *pHVar5;
  HighsBasis *pHVar6;
  vector<double,_std::allocator<double>_> *pvVar7;
  bool bVar8;
  HighsBasisStatus HVar9;
  HighsInt HVar10;
  int iVar11;
  HighsInt iCol;
  HighsInt iRow;
  long lVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  uint uVar15;
  double dVar16;
  undefined8 in_XMM1_Qb;
  double dVar17;
  vector<double,_std::allocator<double>_> *pvVar18;
  value_type_conflict1 local_100;
  double local_f8;
  undefined8 uStack_f0;
  vector<double,_std::allocator<double>_> *local_e8;
  undefined8 uStack_e0;
  vector<double,_std::allocator<double>_> *local_d8;
  undefined8 uStack_d0;
  HighsSolution *local_c8;
  HighsBasis *local_c0;
  double local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  double local_88;
  undefined8 uStack_80;
  vector<double,_std::allocator<double>_> *local_78;
  HighsModelStatus *local_70;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *local_68;
  vector<double,_std::allocator<double>_> *local_60;
  undefined1 local_58 [16];
  undefined4 local_48;
  uint uStack_44;
  undefined4 uStack_40;
  uint uStack_3c;
  
  resetModelStatusAndHighsInfo(model_status,highs_info);
  if ((0 < lp->num_row_) && (HVar10 = HighsSparseMatrix::numNz(&lp->a_matrix_), 0 < HVar10)) {
    return kError;
  }
  local_70 = model_status;
  highsLogUser(&(options->super_HighsOptionsStruct).log_options,kInfo,
               "Solving an unconstrained LP with %d columns\n",(ulong)(uint)lp->num_col_);
  local_78 = &solution->col_value;
  local_100 = 0.0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (local_78,(long)lp->num_col_,&local_100);
  local_60 = &solution->col_dual;
  local_100 = 0.0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (local_60,(long)lp->num_col_,&local_100);
  local_68 = &basis->col_status;
  local_100 = (value_type_conflict1)CONCAT71(local_100._1_7_,4);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::_M_fill_assign
            (local_68,(long)lp->num_col_,(value_type *)&local_100);
  pdVar2 = (solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  pdVar2 = (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  pHVar3 = (basis->row_status).
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((basis->row_status).super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
      _M_impl.super__Vector_impl_data._M_finish != pHVar3) {
    (basis->row_status).super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
    _M_impl.super__Vector_impl_data._M_finish = pHVar3;
  }
  local_b8 = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
  uStack_b0 = 0;
  local_a8 = (options->super_HighsOptionsStruct).dual_feasibility_tolerance;
  uStack_a0 = 0;
  local_88 = lp->offset_;
  uStack_80 = 0;
  (highs_info->super_HighsInfoStruct).num_primal_infeasibilities = 0;
  (highs_info->super_HighsInfoStruct).num_dual_infeasibilities = 0;
  (highs_info->super_HighsInfoStruct).max_primal_infeasibility = 0.0;
  (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities = 0.0;
  (highs_info->super_HighsInfoStruct).max_dual_infeasibility = 0.0;
  (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities = 0.0;
  iVar11 = lp->num_row_;
  local_c8 = solution;
  local_c0 = basis;
  if (0 < iVar11) {
    local_e8 = &solution->row_value;
    uStack_90 = 0;
    uStack_8c = 0x80000000;
    local_98 = -local_b8;
    for (lVar12 = 0; lVar12 < iVar11; lVar12 = lVar12 + 1) {
      local_f8 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12];
      if (local_f8 <= local_b8) {
        dVar16 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12];
        local_f8 = 0.0;
        if (dVar16 < local_98) {
          local_f8 = -dVar16;
        }
      }
      local_100 = 0.0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_e8,&local_100);
      local_100 = 0.0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (&solution->row_dual,&local_100);
      local_100 = (value_type_conflict1)CONCAT71(local_100._1_7_,1);
      std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
      emplace_back<HighsBasisStatus>(&basis->row_status,(HighsBasisStatus *)&local_100);
      in_XMM1_Qb = 0;
      if (local_b8 < local_f8) {
        pHVar1 = &(highs_info->super_HighsInfoStruct).num_primal_infeasibilities;
        *pHVar1 = *pHVar1 + 1;
      }
      (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities =
           (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities + local_f8;
      dVar16 = (highs_info->super_HighsInfoStruct).max_primal_infeasibility;
      uVar13 = SUB84(dVar16,0);
      uVar14 = (undefined4)((ulong)dVar16 >> 0x20);
      if (dVar16 <= local_f8) {
        uVar13 = SUB84(local_f8,0);
        uVar14 = (undefined4)((ulong)local_f8 >> 0x20);
      }
      (highs_info->super_HighsInfoStruct).max_primal_infeasibility = (double)CONCAT44(uVar14,uVar13)
      ;
      iVar11 = lp->num_row_;
    }
  }
  pvVar7 = local_78;
  pHVar6 = local_c0;
  pHVar5 = local_c8;
  uStack_44 = local_a8._4_4_ ^ 0x80000000;
  uStack_3c = uStack_a0._4_4_ ^ 0x80000000;
  local_48 = (undefined4)local_a8;
  uStack_40 = (undefined4)uStack_a0;
  lVar12 = 0;
  do {
    if (lp->num_col_ <= lVar12) {
      (highs_info->super_HighsInfoStruct).objective_function_value = local_88;
      pHVar5->value_valid = true;
      pHVar5->dual_valid = true;
      pHVar6->valid = true;
      pHVar6->useful = true;
      (highs_info->super_HighsInfoStruct).basis_validity = 1;
      setSolutionStatus(highs_info);
      HVar4 = kInfeasible;
      if ((highs_info->super_HighsInfoStruct).num_primal_infeasibilities == 0) {
        HVar4 = (uint)((highs_info->super_HighsInfoStruct).num_dual_infeasibilities != 0) * 3 +
                kOptimal;
      }
      *local_70 = HVar4;
      return kOk;
    }
    local_98 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar12];
    local_f8 = (double)lp->sense_ * local_98;
    local_d8 = (vector<double,_std::allocator<double>_> *)
               (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar12];
    local_e8 = (vector<double,_std::allocator<double>_> *)
               (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar12];
    uStack_e0 = 0;
    uStack_d0 = 0;
    uStack_f0 = in_XMM1_Qb;
    if ((double)local_d8 <= (double)local_e8) {
      dVar16 = (double)((ulong)local_d8 ^ (ulong)DAT_003990d0);
      local_58._8_4_ = DAT_003990d0._8_4_;
      local_58._0_8_ = dVar16;
      local_58._12_4_ = DAT_003990d0._12_4_;
      bVar8 = highs_isInfinity(dVar16);
      if ((bVar8) && (bVar8 = highs_isInfinity((double)local_e8), bVar8)) {
        uVar13 = SUB84(ABS(local_f8),0);
        uVar15 = (uint)((ulong)ABS(local_f8) >> 0x20);
        HVar9 = kZero;
        dVar16 = 0.0;
        pvVar18 = (vector<double,_std::allocator<double>_> *)0x0;
      }
      else if (local_a8 <= local_f8) {
        bVar8 = highs_isInfinity((double)local_58._0_8_);
        dVar16 = 0.0;
        if (bVar8) {
          uVar13 = SUB84(local_f8,0);
          uVar15 = (uint)((ulong)local_f8 >> 0x20);
LAB_00273210:
          HVar9 = kUpper;
          dVar16 = 0.0;
          pvVar18 = local_e8;
        }
        else {
          HVar9 = kLower;
          uVar13 = 0;
          uVar15 = 0;
          pvVar18 = local_d8;
        }
      }
      else if (local_f8 <= (double)CONCAT44(uStack_44,local_48)) {
        bVar8 = highs_isInfinity((double)local_e8);
        dVar16 = 0.0;
        if (!bVar8) {
          uVar13 = 0;
          uVar15 = 0;
          goto LAB_00273210;
        }
        uVar15 = (uint)((ulong)local_f8 >> 0x20) ^ 0x80000000;
        uVar13 = SUB84(local_f8,0);
        HVar9 = kLower;
        pvVar18 = local_d8;
      }
      else {
        bVar8 = highs_isInfinity((double)local_58._0_8_);
        pvVar18 = local_e8;
        if (!bVar8) {
          pvVar18 = local_d8;
        }
        HVar9 = bVar8 * '\x02';
        uVar13 = SUB84(ABS(local_f8),0);
        uVar15 = (uint)((ulong)ABS(local_f8) >> 0x20);
        dVar16 = 0.0;
      }
    }
    else {
      bVar8 = highs_isInfinity((double)local_d8);
      if (bVar8) {
        bVar8 = highs_isInfinity(-(double)local_e8);
        if (bVar8) {
          uVar13 = SUB84(ABS(local_f8),0);
          uVar15 = (uint)((ulong)ABS(local_f8) >> 0x20);
          HVar9 = kZero;
          dVar16 = INFINITY;
          pvVar18 = (vector<double,_std::allocator<double>_> *)0x0;
        }
        else {
          dVar16 = (double)local_d8 - (double)local_e8;
          uVar13 = 0;
          uVar15 = 0;
          if (0.0 <= local_f8) {
            uVar13 = SUB84(local_f8,0);
            uVar15 = (uint)((ulong)local_f8 >> 0x20);
          }
          HVar9 = kUpper;
          pvVar18 = local_e8;
        }
      }
      else {
        dVar16 = (double)local_d8 - (double)local_e8;
        uVar13 = 0;
        uVar15 = 0;
        if (0.0 <= -local_f8) {
          uVar13 = SUB84(local_f8,0);
          uVar15 = (uint)((ulong)-local_f8 >> 0x20);
        }
        HVar9 = kLower;
        pvVar18 = local_d8;
      }
    }
    (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start[lVar12] = (double)pvVar18;
    (local_60->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start[lVar12] = local_f8 * (double)lp->sense_;
    (local_68->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>)._M_impl.
    super__Vector_impl_data._M_start[lVar12] = HVar9;
    if (local_b8 < dVar16) {
      pHVar1 = &(highs_info->super_HighsInfoStruct).num_primal_infeasibilities;
      *pHVar1 = *pHVar1 + 1;
    }
    (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities =
         (highs_info->super_HighsInfoStruct).sum_primal_infeasibilities + dVar16;
    dVar17 = (highs_info->super_HighsInfoStruct).max_primal_infeasibility;
    if (dVar17 <= dVar16) {
      dVar17 = dVar16;
    }
    (highs_info->super_HighsInfoStruct).max_primal_infeasibility = dVar17;
    if (local_a8 <= (double)CONCAT44(uVar15,uVar13) && (double)CONCAT44(uVar15,uVar13) != local_a8)
    {
      pHVar1 = &(highs_info->super_HighsInfoStruct).num_dual_infeasibilities;
      *pHVar1 = *pHVar1 + 1;
    }
    local_88 = local_88 + (double)pvVar18 * local_98;
    (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities =
         (highs_info->super_HighsInfoStruct).sum_dual_infeasibilities +
         (double)CONCAT44(uVar15,uVar13);
    dVar16 = (highs_info->super_HighsInfoStruct).max_dual_infeasibility;
    in_XMM1_Qb = 0;
    if (dVar16 <= (double)CONCAT44(uVar15,uVar13)) {
      dVar16 = (double)CONCAT44(uVar15,uVar13);
    }
    (highs_info->super_HighsInfoStruct).max_dual_infeasibility = dVar16;
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

HighsStatus solveUnconstrainedLp(const HighsOptions& options, const HighsLp& lp,
                                 HighsModelStatus& model_status,
                                 HighsInfo& highs_info, HighsSolution& solution,
                                 HighsBasis& basis) {
  // Aliase to model status and solution parameters
  resetModelStatusAndHighsInfo(model_status, highs_info);

  // Check that the LP really is unconstrained!
  assert(lp.num_row_ == 0 || lp.a_matrix_.numNz() == 0);
  if (lp.num_row_ > 0) {
    // LP has rows, but should only be here if the constraint matrix
    // is zero
    if (lp.a_matrix_.numNz() > 0) return HighsStatus::kError;
  }

  highsLogUser(options.log_options, HighsLogType::kInfo,
               "Solving an unconstrained LP with %" HIGHSINT_FORMAT
               " columns\n",
               lp.num_col_);
  solution.col_value.assign(lp.num_col_, 0);
  solution.col_dual.assign(lp.num_col_, 0);
  basis.col_status.assign(lp.num_col_, HighsBasisStatus::kNonbasic);
  // No rows for primal solution, dual solution or basis
  solution.row_value.clear();
  solution.row_dual.clear();
  basis.row_status.clear();

  double primal_feasibility_tolerance = options.primal_feasibility_tolerance;
  double dual_feasibility_tolerance = options.dual_feasibility_tolerance;

  // Initialise the objective value calculation. Done using
  // HighsSolution so offset is vanilla
  double objective = lp.offset_;

  highs_info.num_primal_infeasibilities = 0;
  highs_info.max_primal_infeasibility = 0;
  highs_info.sum_primal_infeasibilities = 0;
  highs_info.num_dual_infeasibilities = 0;
  highs_info.max_dual_infeasibility = 0;
  highs_info.sum_dual_infeasibilities = 0;

  if (lp.num_row_ > 0) {
    // Assign primal, dual and basis status for rows, checking for
    // infeasibility
    for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
      double primal_infeasibility = 0;
      double lower = lp.row_lower_[iRow];
      double upper = lp.row_upper_[iRow];
      if (lower > primal_feasibility_tolerance) {
        // Lower bound too large for zero activity
        primal_infeasibility = lower;
      } else if (upper < -primal_feasibility_tolerance) {
        // Upper bound too small for zero activity
        primal_infeasibility = -upper;
      }
      solution.row_value.push_back(0);
      solution.row_dual.push_back(0);
      basis.row_status.push_back(HighsBasisStatus::kBasic);
      if (primal_infeasibility > primal_feasibility_tolerance)
        highs_info.num_primal_infeasibilities++;
      highs_info.sum_primal_infeasibilities += primal_infeasibility;
      highs_info.max_primal_infeasibility =
          std::max(primal_infeasibility, highs_info.max_primal_infeasibility);
    }
  }

  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    double cost = lp.col_cost_[iCol];
    double dual = (HighsInt)lp.sense_ * cost;
    double lower = lp.col_lower_[iCol];
    double upper = lp.col_upper_[iCol];
    double value;
    double primal_infeasibility = 0;
    double dual_infeasibility = -1;
    HighsBasisStatus status = HighsBasisStatus::kNonbasic;
    if (lower > upper) {
      // Inconsistent bounds, so set the variable to lower bound,
      // unless it's infinite. Otherwise set the variable to upper
      // bound, unless it's infinite. Otherwise set the variable to
      // zero.
      if (highs_isInfinity(lower)) {
        // Lower bound of +inf
        if (highs_isInfinity(-upper)) {
          // Upper bound of -inf
          value = 0;
          status = HighsBasisStatus::kZero;
          primal_infeasibility = kHighsInf;
          dual_infeasibility = std::fabs(dual);
        } else {
          // Finite upper bound - since lower exceeds it
          value = upper;
          status = HighsBasisStatus::kUpper;
          primal_infeasibility = lower - value;
          dual_infeasibility = std::max(dual, 0.);
        }
      } else {
        // Finite lower bound
        value = lower;
        status = HighsBasisStatus::kLower;
        primal_infeasibility = value - upper;
        dual_infeasibility = std::max(-dual, 0.);
      }
    } else if (highs_isInfinity(-lower) && highs_isInfinity(upper)) {
      // Free column: set to zero and record dual infeasibility
      value = 0;
      status = HighsBasisStatus::kZero;
      dual_infeasibility = std::fabs(dual);
    } else if (dual >= dual_feasibility_tolerance) {
      // Column with sufficiently positive dual
      if (!highs_isInfinity(-lower)) {
        // Set to this finite lower bound
        value = lower;
        status = HighsBasisStatus::kLower;
        dual_infeasibility = 0;
      } else {
        // Infinite lower bound so set to upper bound and record dual
        // infeasibility
        value = upper;
        status = HighsBasisStatus::kUpper;
        dual_infeasibility = dual;
      }
    } else if (dual <= -dual_feasibility_tolerance) {
      // Column with sufficiently negative dual
      if (!highs_isInfinity(upper)) {
        // Set to this finite upper bound
        value = upper;
        status = HighsBasisStatus::kUpper;
        dual_infeasibility = 0;
      } else {
        // Infinite upper bound so set to lower bound and record dual
        // infeasibility
        value = lower;
        status = HighsBasisStatus::kLower;
        dual_infeasibility = -dual;
      }
    } else {
      // Column with sufficiently small dual: set to lower bound (if
      // finite) otherwise upper bound
      if (highs_isInfinity(-lower)) {
        value = upper;
        status = HighsBasisStatus::kUpper;
      } else {
        value = lower;
        status = HighsBasisStatus::kLower;
      }
      dual_infeasibility = std::fabs(dual);
    }
    assert(status != HighsBasisStatus::kNonbasic);
    assert(dual_infeasibility >= 0);
    solution.col_value[iCol] = value;
    solution.col_dual[iCol] = (HighsInt)lp.sense_ * dual;
    basis.col_status[iCol] = status;
    objective += value * cost;
    if (primal_infeasibility > primal_feasibility_tolerance)
      highs_info.num_primal_infeasibilities++;
    highs_info.sum_primal_infeasibilities += primal_infeasibility;
    highs_info.max_primal_infeasibility =
        std::max(primal_infeasibility, highs_info.max_primal_infeasibility);
    if (dual_infeasibility > dual_feasibility_tolerance)
      highs_info.num_dual_infeasibilities++;
    highs_info.sum_dual_infeasibilities += dual_infeasibility;
    highs_info.max_dual_infeasibility =
        std::max(dual_infeasibility, highs_info.max_dual_infeasibility);
  }
  highs_info.objective_function_value = objective;
  solution.value_valid = true;
  solution.dual_valid = true;
  basis.valid = true;
  basis.useful = true;
  highs_info.basis_validity = kBasisValidityValid;
  setSolutionStatus(highs_info);
  if (highs_info.num_primal_infeasibilities) {
    // Primal infeasible
    model_status = HighsModelStatus::kInfeasible;
  } else if (highs_info.num_dual_infeasibilities) {
    // Dual infeasible => primal unbounded for unconstrained LP
    model_status = HighsModelStatus::kUnbounded;
  } else {
    model_status = HighsModelStatus::kOptimal;
  }

  return HighsStatus::kOk;
}